

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextV(char *fmt,__va_list_tag *args)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  char *text_end;
  ImGuiContext *g;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    iVar2 = ImFormatStringV(GImGui->TempBuffer,0xc01,fmt,args);
    TextEx(pIVar1->TempBuffer,pIVar1->TempBuffer + iVar2,1);
  }
  return;
}

Assistant:

void ImGui::TextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const char* text_end = g.TempBuffer + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    TextEx(g.TempBuffer, text_end, ImGuiTextFlags_NoWidthForLargeClippedText);
}